

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_sul_timed_callback_vh_protocol_cb(lws_sorted_usec_list_t *sul)

{
  lws_dll2_owner *plVar1;
  long lVar2;
  lws_context_per_thread *pt;
  lws_timed_vh_protocol *tvp;
  lws_sorted_usec_list_t *sul_local;
  
  plVar1 = sul[1].list.next[0xd].owner;
  lVar2 = (long)*(int *)((long)&sul[1].list.owner + 4) * 0x188;
  *(lws_dll2_owner **)(*(long *)((long)plVar1 + lVar2 + 0x298) + 0x1f8) =
       sul[1].list.next[0xd].owner;
  *(lws_dll2 **)(*(long *)((long)plVar1 + lVar2 + 0x298) + 0x200) = sul[1].list.next;
  *(lws_dll2 **)(*(long *)((long)plVar1 + lVar2 + 0x298) + 0x228) = sul[1].list.prev;
  _lws_log(0x10,"%s: timed cb: vh %s, protocol %s, reason %d\n",
           "lws_sul_timed_callback_vh_protocol_cb",sul[1].list.next[0xf].prev,
           (sul[1].list.prev)->prev,(ulong)*(uint *)&sul[1].list.owner);
  (*(code *)(sul[1].list.prev)->next)
            (*(undefined8 *)((long)plVar1 + lVar2 + 0x298),*(undefined4 *)&sul[1].list.owner,0,0);
  __lws_timed_callback_remove((lws_vhost *)sul[1].list.next,(lws_timed_vh_protocol *)&sul[-1].us);
  return;
}

Assistant:

void
lws_sul_timed_callback_vh_protocol_cb(lws_sorted_usec_list_t *sul)
{
	struct lws_timed_vh_protocol *tvp = lws_container_of(sul,
					struct lws_timed_vh_protocol, sul);
	struct lws_context_per_thread *pt =
				&tvp->vhost->context->pt[tvp->tsi_req];

	pt->fake_wsi->context = tvp->vhost->context;

	pt->fake_wsi->vhost = tvp->vhost; /* not a real bound wsi */
	pt->fake_wsi->protocol = tvp->protocol;

	lwsl_debug("%s: timed cb: vh %s, protocol %s, reason %d\n", __func__,
		   tvp->vhost->name, tvp->protocol->name, tvp->reason);

	tvp->protocol->callback(pt->fake_wsi, tvp->reason, NULL, NULL, 0);

	__lws_timed_callback_remove(tvp->vhost, tvp);
}